

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicNull_Test::
iu_SyntaxTest_x_iutest_x_VariadicNull_Test(iu_SyntaxTest_x_iutest_x_VariadicNull_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0039de18;
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicNull)
{
    int* p = NULL;
    if( int x = 1 )
        IUTEST_ASSERT_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_INFORM_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NULL(T<0, 0>::call(p)) << x;
}